

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_law_expansion.cc
# Opt level: O0

void __thiscall
sptk::MuLawExpansion::MuLawExpansion
          (MuLawExpansion *this,double abs_max_value,double compression_factor)

{
  double compression_factor_local;
  double abs_max_value_local;
  MuLawExpansion *this_local;
  
  this->_vptr_MuLawExpansion = (_func_int **)&PTR__MuLawExpansion_00125cc8;
  this->abs_max_value_ = abs_max_value;
  this->compression_factor_ = compression_factor;
  this->constant_ = this->abs_max_value_ / this->compression_factor_;
  this->is_valid_ = true;
  if ((this->abs_max_value_ <= 0.0) || (this->compression_factor_ <= 0.0)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

MuLawExpansion::MuLawExpansion(double abs_max_value, double compression_factor)
    : abs_max_value_(abs_max_value),
      compression_factor_(compression_factor),
      constant_(abs_max_value_ / compression_factor_),
      is_valid_(true) {
  if (abs_max_value_ <= 0.0 || compression_factor_ <= 0.0) {
    is_valid_ = false;
    return;
  }
}